

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O2

N * __thiscall N::ana<std::__cxx11::string>(N *this,CoAlg<std::__cxx11::basic_string<char>_> *coalg)

{
  variant_alternative_t<0UL,_variant<basic_string<char,_char_traits<char>,_allocator<char>_>,_int,_double,_NS_*>_>
  *__args;
  N *this_00;
  function<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_60;
  CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N> local_40 [32];
  
  __args = std::get<0ul,std::__cxx11::string,int,double,NS*>(&this->data);
  this_00 = std::
            function<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(coalg,__args);
  all(this_00);
  std::
  function<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::
  function(&local_60,coalg);
  CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>::
  mapped<N::ana<std::__cxx11::string>(std::function<N*(std::__cxx11::string&)>const&)::_lambda(N*)_1_>
            (local_40,(anon_class_32_1_a7c0f4d0 *)&local_60);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  return this_00;
}

Assistant:

N* ana(const coalg::CoAlg<A>& coalg) {
        auto r = coalg(std::get<A>(this->data));

        r->all().mapped([coalg](N* n){return n->ana(coalg);});

        return r;
    }